

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdPatternColorR5G5B5::emulate_mthd(MthdPatternColorR5G5B5 *this)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  char cVar6;
  uint uVar7;
  
  uVar2 = nv04_pgraph_hswap(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                            (this->super_SingleMthdTest).super_MthdTest.val);
  uVar3 = (ulong)uVar2;
  iVar5 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    cVar6 = (char)(iVar5 << 4);
    uVar7 = (uint)((uVar3 << (0x3bU - cVar6 & 0x3f)) >> 0x3b);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.pattern_color
    [(long)*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 * 2 + (long)iVar5] =
         (uint)((uVar3 << (0x31U - cVar6 & 0x3f)) >> 0x3b) * 0x84000 & 0xff0000 |
         (uint)((uVar3 << (0x36U - cVar6 & 0x3f)) >> 0x3b) * 0x840 & 0xff00 |
         (uVar7 << 5 | uVar7) >> 2;
    iVar5 = 1;
    bVar1 = false;
  } while (bVar4);
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t rval = nv04_pgraph_hswap(&exp, val);
		for (int i = 0; i < 2; i++) {
			uint8_t b = extr(rval, i * 16 + 0, 5) * 0x21 >> 2;
			uint8_t g = extr(rval, i * 16 + 5, 5) * 0x21 >> 2;
			uint8_t r = extr(rval, i * 16 + 10, 5) * 0x21 >> 2;
			exp.pattern_color[idx*2+i] = b | g << 8 | r << 16;
		}
	}